

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

bool __thiscall
phmap::priv::
btree<phmap::priv::set_params<std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::__cxx11::string>,256,true>>
::compare_keys<std::__cxx11::string,std::__cxx11::string>
          (btree<phmap::priv::set_params<std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::__cxx11::string>,256,true>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *x,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *y)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  difference_type __diff;
  ulong uVar4;
  
  uVar1 = x->_M_string_length;
  uVar2 = y->_M_string_length;
  uVar4 = uVar2;
  if (uVar1 < uVar2) {
    uVar4 = uVar1;
  }
  if (uVar4 != 0) {
    uVar3 = memcmp((x->_M_dataplus)._M_p,(y->_M_dataplus)._M_p,uVar4);
    uVar4 = (ulong)uVar3;
    if (uVar3 != 0) goto LAB_002303b5;
  }
  uVar4 = 0xffffffff80000000;
  if (-0x80000000 < (long)(uVar1 - uVar2)) {
    uVar4 = uVar1 - uVar2;
  }
  if (0x7ffffffe < (long)uVar4) {
    uVar4 = 0;
  }
LAB_002303b5:
  return (bool)((byte)(uVar4 >> 0x1f) & 1);
}

Assistant:

bool compare_keys(const K &x, const LK &y) const {
            return compare_internal::compare_result_as_less_than(key_comp()(x, y));
        }